

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

void __thiscall
cmListCommand::HandleTransformCommand::ActionDescriptor::~ActionDescriptor(ActionDescriptor *this)

{
  std::_Function_base::~_Function_base(&(this->Transform).super__Function_base);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

ActionDescriptor(std::string name)
      : Name(std::move(name))
    {
    }